

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::RunChild(cmCTestLaunch *this)

{
  cmsysProcess *cp_00;
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  reference __lhs;
  long lVar4;
  ulong uVar5;
  string local_4a0;
  string local_480;
  int local_45c;
  undefined1 local_458 [4];
  int p;
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_430;
  int length;
  char *data;
  char local_418 [8];
  ofstream ferr;
  ofstream fout;
  cmsysProcess *cp;
  cmCTestLaunch *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->RealArgs);
  if (!bVar1) {
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->RealArgs,0);
    bVar1 = std::operator==(__lhs,":");
    if (!bVar1) {
      cp_00 = this->Process;
      cmsysProcess_SetCommand(cp_00,this->RealArgV);
      std::ofstream::ofstream(&ferr.field_0x1f8);
      std::ofstream::ofstream(local_418);
      if ((this->Passthru & 1U) == 0) {
        _Var2 = std::__cxx11::string::c_str();
        std::operator|(_S_out,_S_bin);
        std::ofstream::open(&ferr.field_0x1f8,_Var2);
        _Var2 = std::__cxx11::string::c_str();
        std::operator|(_S_out,_S_bin);
        std::ofstream::open(local_418,_Var2);
      }
      else {
        cmsysProcess_SetPipeShared(cp_00,2,1);
        cmsysProcess_SetPipeShared(cp_00,3,1);
      }
      cmsysProcess_Execute(cp_00);
      if ((this->Passthru & 1U) == 0) {
        pcStack_430 = (char *)0x0;
        strdata.field_2._12_4_ = 0;
        cmProcessOutput::cmProcessOutput
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),Auto,0x400);
        std::__cxx11::string::string((string *)local_458);
        while (local_45c = cmsysProcess_WaitForData
                                     (cp_00,&stack0xfffffffffffffbd0,
                                      (int *)(strdata.field_2._M_local_buf + 0xc),(double *)0x0),
              local_45c != 0) {
          if (local_45c == 2) {
            cmProcessOutput::DecodeText
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_430,
                       (long)(int)strdata.field_2._12_4_,(string *)local_458,1);
            lVar4 = std::__cxx11::string::c_str();
            std::__cxx11::string::size();
            std::ostream::write(&ferr.field_0x1f8,lVar4);
            lVar4 = std::__cxx11::string::c_str();
            std::__cxx11::string::size();
            std::ostream::write((char *)&std::cout,lVar4);
            this->HaveOut = true;
          }
          else if (local_45c == 3) {
            cmProcessOutput::DecodeText
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_430,
                       (long)(int)strdata.field_2._12_4_,(string *)local_458,2);
            lVar4 = std::__cxx11::string::c_str();
            std::__cxx11::string::size();
            std::ostream::write(local_418,lVar4);
            lVar4 = std::__cxx11::string::c_str();
            std::__cxx11::string::size();
            std::ostream::write((char *)&std::cerr,lVar4);
            this->HaveErr = true;
          }
        }
        std::__cxx11::string::string((string *)&local_480);
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_480,
                   (string *)local_458,1);
        std::__cxx11::string::~string((string *)&local_480);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          lVar4 = std::__cxx11::string::c_str();
          std::__cxx11::string::size();
          std::ostream::write(&ferr.field_0x1f8,lVar4);
          lVar4 = std::__cxx11::string::c_str();
          std::__cxx11::string::size();
          std::ostream::write((char *)&std::cout,lVar4);
        }
        std::__cxx11::string::string((string *)&local_4a0);
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_4a0,
                   (string *)local_458,2);
        std::__cxx11::string::~string((string *)&local_4a0);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          lVar4 = std::__cxx11::string::c_str();
          std::__cxx11::string::size();
          std::ostream::write(local_418,lVar4);
          lVar4 = std::__cxx11::string::c_str();
          std::__cxx11::string::size();
          std::ostream::write((char *)&std::cerr,lVar4);
        }
        std::__cxx11::string::~string((string *)local_458);
        cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb));
      }
      cmsysProcess_WaitForExit(cp_00,(double *)0x0);
      iVar3 = cmsysProcess_GetExitValue(cp_00);
      this->ExitCode = iVar3;
      std::ofstream::~ofstream(local_418);
      std::ofstream::~ofstream(&ferr.field_0x1f8);
      return;
    }
  }
  this->ExitCode = 0;
  return;
}

Assistant:

void cmCTestLaunch::RunChild()
{
  // Ignore noopt make rules
  if (this->RealArgs.empty() || this->RealArgs[0] == ":") {
    this->ExitCode = 0;
    return;
  }

  // Prepare to run the real command.
  cmsysProcess* cp = this->Process;
  cmsysProcess_SetCommand(cp, this->RealArgV);

  cmsys::ofstream fout;
  cmsys::ofstream ferr;
  if (this->Passthru) {
    // In passthru mode we just share the output pipes.
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
  } else {
    // In full mode we record the child output pipes to log files.
    fout.open(this->LogOut.c_str(), std::ios::out | std::ios::binary);
    ferr.open(this->LogErr.c_str(), std::ios::out | std::ios::binary);
  }

#ifdef _WIN32
  // Do this so that newline transformation is not done when writing to cout
  // and cerr below.
  _setmode(fileno(stdout), _O_BINARY);
  _setmode(fileno(stderr), _O_BINARY);
#endif

  // Run the real command.
  cmsysProcess_Execute(cp);

  // Record child stdout and stderr if necessary.
  if (!this->Passthru) {
    char* data = nullptr;
    int length = 0;
    cmProcessOutput processOutput;
    std::string strdata;
    while (int p = cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
      if (p == cmsysProcess_Pipe_STDOUT) {
        processOutput.DecodeText(data, length, strdata, 1);
        fout.write(strdata.c_str(), strdata.size());
        std::cout.write(strdata.c_str(), strdata.size());
        this->HaveOut = true;
      } else if (p == cmsysProcess_Pipe_STDERR) {
        processOutput.DecodeText(data, length, strdata, 2);
        ferr.write(strdata.c_str(), strdata.size());
        std::cerr.write(strdata.c_str(), strdata.size());
        this->HaveErr = true;
      }
    }
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      fout.write(strdata.c_str(), strdata.size());
      std::cout.write(strdata.c_str(), strdata.size());
    }
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      ferr.write(strdata.c_str(), strdata.size());
      std::cerr.write(strdata.c_str(), strdata.size());
    }
  }

  // Wait for the real command to finish.
  cmsysProcess_WaitForExit(cp, nullptr);
  this->ExitCode = cmsysProcess_GetExitValue(cp);
}